

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O1

bool Allocations::allocateSubArea
               (int64_t fileID,int64_t *position,int64_t minRange,int64_t maxRange,int64_t size)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  Key local_68;
  _Base_ptr local_58;
  _Base_ptr p_Stack_50;
  undefined8 local_48;
  SubArea local_40;
  
  bVar9 = (_Rb_tree_header *)allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &allocations._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar9) {
    do {
      local_68.fileID = *(int64_t *)(p_Var3 + 1);
      local_68.position = (int64_t)p_Var3[1]._M_parent;
      local_58 = p_Var3[1]._M_left;
      p_Var2 = p_Var3[1]._M_right;
      local_48 = *(undefined8 *)(p_Var3 + 2);
      iVar8 = 3;
      p_Stack_50 = p_Var2;
      if ((((local_68.fileID == fileID) &&
           (local_48._1_1_ = (char)((ulong)local_48 >> 8), bVar10 = local_48._1_1_ == '\x01', bVar10
           )) && ((minRange == -1 ||
                  (minRange <=
                   (long)&((_Base_ptr)local_68.position)->_M_color + (long)&local_58->_M_color))))
         && (maxRange == -1 || local_68.position <= maxRange)) {
        iVar4 = getSubAreaUsage(local_68.fileID,local_68.position);
        lVar5 = (long)&p_Var2->_M_color + iVar4;
        lVar6 = (long)(_Rb_tree_color *)local_68.position + lVar5;
        if ((minRange == -1 || minRange <= lVar6) && (maxRange == -1 || lVar6 <= maxRange)) {
          if ((keepPositions == true) &&
             (((lVar1 = *position, lVar1 != -1 && (lVar6 < lVar1)) &&
              (lVar7 = lVar1 - local_68.position, lVar7 != lVar5 && lVar7 + size <= (long)local_58))
             )) {
            size = (size - lVar5) + lVar7;
            keptPositions = true;
            lVar6 = lVar1;
          }
          iVar8 = 0;
          if (size + lVar5 <= (long)local_58) {
            *position = lVar6;
            local_40.offset = lVar5;
            local_40.size = size;
            std::
            _Rb_tree<Allocations::Key,std::pair<Allocations::Key_const,Allocations::SubArea>,std::_Select1st<std::pair<Allocations::Key_const,Allocations::SubArea>>,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::SubArea>>>
            ::_M_emplace_equal<Allocations::Key_const&,Allocations::SubArea>
                      ((_Rb_tree<Allocations::Key,std::pair<Allocations::Key_const,Allocations::SubArea>,std::_Select1st<std::pair<Allocations::Key_const,Allocations::SubArea>>,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::SubArea>>>
                        *)&subAreas,&local_68,&local_40);
            iVar8 = 1;
          }
        }
      }
      if ((iVar8 != 3) && (iVar8 != 0)) {
        if (bVar9 == false) {
          nextKeepPositions = false;
          return false;
        }
        return bVar9;
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      bVar9 = (_Rb_tree_header *)p_Var3 != &allocations._M_t._M_impl.super__Rb_tree_header;
    } while (bVar9);
  }
  nextKeepPositions = false;
  return bVar9;
}

Assistant:

bool Allocations::allocateSubArea(int64_t fileID, int64_t& position, int64_t minRange, int64_t maxRange, int64_t size)
{
	for (auto it : allocations)
	{
		if (it.first.fileID != fileID || !it.second.shared)
			continue;
		if (minRange != -1 && it.first.position + it.second.space < minRange)
			continue;
		if (maxRange != -1 && it.first.position > maxRange)
			continue;

		int64_t actualUsage = it.second.usage + getSubAreaUsage(it.first);
		int64_t possiblePosition = it.first.position + actualUsage;
		if (minRange != -1 && possiblePosition < minRange)
			continue;
		if (maxRange != -1 && possiblePosition > maxRange)
			continue;

		// Can we use the position it had before?  Nudge up size if so.
		if (keepPositions && position != -1 && position > possiblePosition)
		{
			int64_t offset = position - it.first.position;
			if (it.second.space >= offset + size && offset != actualUsage)
			{
				size += offset - actualUsage;
				keptPositions = true;
				// Fall through to reuse the emplace.
				possiblePosition = position;
			}
		}

		if (it.second.space >= actualUsage + size)
		{
			position = possiblePosition;
			subAreas.emplace(it.first, SubArea{ actualUsage, size });
			return true;
		}
	}

	nextKeepPositions = false;
	return false;
}